

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec_vproc.cpp
# Opt level: O1

MPP_RET dec_vproc_config_dei_v2(MppDecVprocCtxImpl *ctx,MppFrame frm,IEP2_DIL_MODE dil_mode)

{
  IEP2_FIELD_ORDER IVar1;
  iep_com_ops *piVar2;
  int iVar3;
  MPP_RET extraout_EAX;
  MPP_RET extraout_EAX_00;
  RK_U32 RVar4;
  uint uVar5;
  MPP_RET MVar6;
  MppBuffer pvVar7;
  IepCmd cmd;
  MppFrame frame;
  ulong uVar8;
  uint uVar9;
  IepImg img;
  IepImg local_74;
  undefined4 local_58;
  IEP2_DIL_MODE IStack_54;
  undefined4 uStack_50;
  uint uStack_4c;
  long local_48;
  ulong uStack_40;
  iep_com_ops *local_38;
  
  if (frm == (MppFrame)0x0) {
    _mpp_log_l(2,"mpp_dec_vproc","found NULL pointer frm\n",(char *)0x0);
    return extraout_EAX_00;
  }
  if ((ctx->out_buf0 == (MppBuffer)0x0) || (ctx->out_buf1 == (MppBuffer)0x0)) {
    _mpp_log_l(2,"mpp_dec_vproc","found NULL pointer out_buf0 %p out_buf1 %p\n",(char *)0x0,
               ctx->out_buf0,ctx->out_buf1);
    return extraout_EAX;
  }
  local_38 = ctx->com_ctx->ops;
  dec_vproc_set_img_fmt(&local_74,frm);
  if (((byte)vproc_debug & 0x10) != 0) {
    dump_mppbuffer((MppBuffer)0x0,"/data/dump/dump_in.yuv",(uint)local_74.vir_w,(uint)local_74.vir_h
                  );
  }
  if (((byte)vproc_debug & 2) != 0) {
    _mpp_log_l(4,"mpp_dec_vproc","set dil_mode %d\n","dec_vproc_config_dei_v2",(ulong)dil_mode);
  }
  if (dil_mode - IEP2_DIL_MODE_I5O2 < 3) {
LAB_0017b750:
    pvVar7 = mpp_frame_get_buffer(ctx->prev_frm0);
    iVar3 = mpp_buffer_get_fd_with_caller(pvVar7,"dec_vproc_config_dei_v2");
    dec_vproc_set_img(ctx,&local_74,iVar3,IEP_CMD_SET_SRC);
    pvVar7 = mpp_frame_get_buffer(frm);
    iVar3 = mpp_buffer_get_fd_with_caller(pvVar7,"dec_vproc_config_dei_v2");
    dec_vproc_set_img(ctx,&local_74,iVar3,IEP_CMD_SET_DEI_SRC1);
    pvVar7 = mpp_frame_get_buffer(ctx->prev_frm1);
    iVar3 = mpp_buffer_get_fd_with_caller(pvVar7,"dec_vproc_config_dei_v2");
  }
  else {
    if (dil_mode == IEP2_DIL_MODE_PD) {
      pvVar7 = mpp_frame_get_buffer(frm);
      iVar3 = mpp_buffer_get_fd_with_caller(pvVar7,"dec_vproc_config_dei_v2");
      dec_vproc_set_img(ctx,&local_74,iVar3,IEP_CMD_SET_DEI_SRC1);
      frame = ctx->prev_frm0;
      if ((frame != (MppFrame)0x0) || (frame = ctx->prev_frm1, frame != (MppFrame)0x0)) {
        pvVar7 = mpp_frame_get_buffer(frame);
        iVar3 = mpp_buffer_get_fd_with_caller(pvVar7,"dec_vproc_config_dei_v2");
      }
      cmd = IEP_CMD_SET_SRC;
    }
    else {
      if (dil_mode == IEP2_DIL_MODE_DECT) goto LAB_0017b750;
      pvVar7 = mpp_frame_get_buffer(frm);
      iVar3 = mpp_buffer_get_fd_with_caller(pvVar7,"dec_vproc_config_dei_v2");
      dec_vproc_set_img(ctx,&local_74,iVar3,IEP_CMD_SET_SRC);
      cmd = IEP_CMD_SET_DEI_SRC1;
    }
    dec_vproc_set_img(ctx,&local_74,iVar3,cmd);
  }
  dec_vproc_set_img(ctx,&local_74,iVar3,IEP_CMD_SET_DEI_SRC2);
  iVar3 = mpp_buffer_get_fd_with_caller(ctx->out_buf0,"dec_vproc_config_dei_v2");
  dec_vproc_set_img(ctx,&local_74,iVar3,IEP_CMD_SET_DST);
  iVar3 = mpp_buffer_get_fd_with_caller(ctx->out_buf1,"dec_vproc_config_dei_v2");
  dec_vproc_set_img(ctx,&local_74,iVar3,IEP_CMD_SET_DEI_DST1);
  uStack_4c = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 1;
  uStack_50 = 0;
  IStack_54 = dil_mode;
  RVar4 = mpp_frame_get_mode(frm);
  if ((~RVar4 & 0xc) == 0) {
    uStack_4c = 2;
  }
  else if ((RVar4 & 4) == 0) {
    uStack_4c = 1;
  }
  else {
    uStack_4c = 0;
  }
  if (ctx->pre_ff_mode == IEP2_FF_MODE_FIELD) {
    uVar9 = (RVar4 & 4) >> 2;
    IVar1 = (ctx->dei_info).dil_order;
    uVar5 = (uint)(IVar1 == IEP2_FIELD_ORDER_TFF);
    if (IVar1 == IEP2_FIELD_ORDER_UND) {
      uVar5 = uVar9;
    }
    uVar8 = (ulong)uVar9;
    if ((uVar5 != uVar9) &&
       (uVar8 = (ulong)uVar9, 0x1e < (ctx->dei_info).dil_order_confidence_ratio)) {
      uVar8 = (ulong)uVar5;
    }
    uStack_4c = (uint)((int)uVar8 == 0);
    if (((byte)vproc_debug & 2) != 0) {
      _mpp_log_l(4,"mpp_dec_vproc","Config field order: is TFF %d, syn %d vs iep %d\n",
                 "dec_vproc_config_dei_v2",uVar8,(ulong)uVar9,uVar5);
    }
  }
  piVar2 = local_38;
  (*local_38->control)(ctx->iep_ctx,IEP_CMD_SET_DEI_CFG,&local_58);
  local_58 = 0;
  IStack_54 = 3;
  uStack_50 = 0;
  uStack_4c = 3;
  local_48 = (ulong)local_74.act_w << 0x20;
  uStack_40 = (ulong)CONCAT24(local_74.vir_w,(uint)local_74.act_h);
  MVar6 = (*piVar2->control)(ctx->iep_ctx,IEP_CMD_SET_DEI_CFG,&local_58);
  return MVar6;
}

Assistant:

static MPP_RET dec_vproc_config_dei_v2(MppDecVprocCtxImpl *ctx, MppFrame frm,
                                       enum IEP2_DIL_MODE dil_mode)
{
    MPP_RET ret = MPP_OK;
    MppBuffer buf = NULL;
    RK_S32 fd = -1;
    IepImg img;
    struct iep2_api_params params;
    iep_com_ops *ops = ctx->com_ctx->ops;

    if (!frm) {
        mpp_err("found NULL pointer frm\n");
        ret = MPP_ERR_NULL_PTR;
        return ret;
    }

    /* default alloc 2 out buffer for IEP */
    if (!ctx->out_buf0 || !ctx->out_buf1) {
        mpp_err("found NULL pointer out_buf0 %p out_buf1 %p\n", ctx->out_buf0, ctx->out_buf1);
        ret = MPP_ERR_NULL_PTR;
        return ret;
    }

    // setup source IepImg
    dec_vproc_set_img_fmt(&img, frm);

    if (vproc_debug & VPROC_DBG_DUMP_IN)
        dump_mppbuffer(buf, "/data/dump/dump_in.yuv", img.vir_w, img.vir_h);

    vproc_dbg_status("set dil_mode %d\n", dil_mode);
    // TODO: check the input frame
    switch (dil_mode) {
    case IEP2_DIL_MODE_I5O2:
    case IEP2_DIL_MODE_I5O1T:
    case IEP2_DIL_MODE_I5O1B:
    case IEP2_DIL_MODE_DECT: {
        // require 3 frames
        buf = mpp_frame_get_buffer(ctx->prev_frm0);
        fd = mpp_buffer_get_fd(buf);
        dec_vproc_set_img(ctx, &img, fd, IEP_CMD_SET_SRC);

        buf = mpp_frame_get_buffer(frm);
        fd = mpp_buffer_get_fd(buf);
        dec_vproc_set_img(ctx, &img, fd, IEP_CMD_SET_DEI_SRC1);

        buf = mpp_frame_get_buffer(ctx->prev_frm1);
        fd = mpp_buffer_get_fd(buf);
        dec_vproc_set_img(ctx, &img, fd, IEP_CMD_SET_DEI_SRC2);
    } break;
    case IEP2_DIL_MODE_PD: {
        // require 2 frame
        buf = mpp_frame_get_buffer(frm);
        fd = mpp_buffer_get_fd(buf);
        dec_vproc_set_img(ctx, &img, fd, IEP_CMD_SET_DEI_SRC1);

        if (ctx->prev_frm0) {
            buf = mpp_frame_get_buffer(ctx->prev_frm0);
            fd = mpp_buffer_get_fd(buf);
        } else if (ctx->prev_frm1) {
            buf = mpp_frame_get_buffer(ctx->prev_frm1);
            fd = mpp_buffer_get_fd(buf);
        }

        dec_vproc_set_img(ctx, &img, fd, IEP_CMD_SET_SRC);
        dec_vproc_set_img(ctx, &img, fd, IEP_CMD_SET_DEI_SRC2);
    } break;
    case IEP2_DIL_MODE_I2O2:
    case IEP2_DIL_MODE_I1O1T:
    case IEP2_DIL_MODE_I1O1B:
    case IEP2_DIL_MODE_BYPASS:
    default: {
        buf = mpp_frame_get_buffer(frm);
        fd = mpp_buffer_get_fd(buf);
        dec_vproc_set_img(ctx, &img, fd, IEP_CMD_SET_SRC);
        dec_vproc_set_img(ctx, &img, fd, IEP_CMD_SET_DEI_SRC1);
        dec_vproc_set_img(ctx, &img, fd, IEP_CMD_SET_DEI_SRC2);
    } break;
    }

    // setup output
    fd = mpp_buffer_get_fd(ctx->out_buf0);
    dec_vproc_set_img(ctx, &img, fd, IEP_CMD_SET_DST);
    fd = mpp_buffer_get_fd(ctx->out_buf1);
    dec_vproc_set_img(ctx, &img, fd, IEP_CMD_SET_DEI_DST1);

    memset(&params, 0, sizeof(params));
    params.ptype = IEP2_PARAM_TYPE_MODE;
    params.param.mode.dil_mode = dil_mode;
    params.param.mode.out_mode = IEP2_OUT_MODE_LINE;
    {
        RK_U32 mode = mpp_frame_get_mode(frm);
        RK_U32 fo_from_syntax = (mode & MPP_FRAME_FLAG_TOP_FIRST) ? 1 : 0;

        /* refer to syntax */
        if ((mode & MPP_FRAME_FLAG_TOP_FIRST) && (mode & MPP_FRAME_FLAG_BOT_FIRST))
            params.param.mode.dil_order = IEP2_FIELD_ORDER_UND;
        else if (fo_from_syntax)
            params.param.mode.dil_order = IEP2_FIELD_ORDER_TFF;
        else
            params.param.mode.dil_order = IEP2_FIELD_ORDER_BFF;

        /* refer to IEP */
        if (ctx->pre_ff_mode == IEP2_FF_MODE_FIELD) {
            RK_U32 fo_from_iep = (ctx->dei_info.dil_order == IEP2_FIELD_ORDER_UND) ?
                                 fo_from_syntax : (ctx->dei_info.dil_order == IEP2_FIELD_ORDER_TFF);
            RK_U32 is_tff = 0;

            if (fo_from_iep != fo_from_syntax) {
                if (ctx->dei_info.dil_order_confidence_ratio > 30)
                    is_tff = fo_from_iep;
                else
                    is_tff = fo_from_syntax;
            } else {
                is_tff = fo_from_syntax;
            }

            if (is_tff)
                params.param.mode.dil_order = IEP2_FIELD_ORDER_TFF;
            else
                params.param.mode.dil_order = IEP2_FIELD_ORDER_BFF;

            vproc_dbg_status("Config field order: is TFF %d, syn %d vs iep %d\n",
                             is_tff, fo_from_syntax, fo_from_iep);
        }
    }
    ops->control(ctx->iep_ctx, IEP_CMD_SET_DEI_CFG, &params);

    memset(&params, 0, sizeof(params));
    params.ptype = IEP2_PARAM_TYPE_COM;
    params.param.com.sfmt = IEP2_FMT_YUV420;
    params.param.com.dfmt = IEP2_FMT_YUV420;
    params.param.com.sswap = IEP2_YUV_SWAP_SP_UV;
    params.param.com.dswap = IEP2_YUV_SWAP_SP_UV;
    params.param.com.width = img.act_w;
    params.param.com.height = img.act_h;
    params.param.com.hor_stride = img.vir_w;//img.act_w;
    ops->control(ctx->iep_ctx, IEP_CMD_SET_DEI_CFG, &params);

    return MPP_OK;
}